

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

SpectrumCheckerboardTexture *
pbrt::SpectrumCheckerboardTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar1;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar2;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar3;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar4;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar5;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar6;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar7;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar8;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar9;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar10;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar11;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar12;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar13;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar14;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  TVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  SpectrumCheckerboardTexture *pSVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  *pTVar20;
  undefined4 extraout_var_03;
  Allocator alloc_00;
  Allocator alloc_01;
  uintptr_t iptr;
  allocator<char> local_f1;
  SpectrumTextureHandle tex2;
  SpectrumTextureHandle tex1;
  int dim;
  Transform *local_d8;
  FileLoc *local_d0;
  TextureMapping2DHandle map;
  ulong local_40;
  ulong local_38;
  undefined4 extraout_var_02;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&map,"dimension",(allocator<char> *)&tex1);
  iVar16 = TextureParameterDictionary::GetOneInt(parameters,(string *)&map,2);
  std::__cxx11::string::~string((string *)&map);
  dim = iVar16;
  if (iVar16 - 4U < 0xfffffffe) {
    Error<int&>(loc,"%d dimensional checkerboard texture not supported",&dim);
    pSVar19 = (SpectrumCheckerboardTexture *)0x0;
  }
  else {
    local_d8 = renderFromTexture;
    local_d0 = loc;
    iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar17) = 0;
    iVar18 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar18) = 0x3f800000;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&map,"tex1",(allocator<char> *)&tex2);
    local_38 = CONCAT44(extraout_var_00,iVar18) | 0x1000000000000;
    alloc_00.memoryResource._4_4_ = 0;
    alloc_00.memoryResource._0_4_ = spectrumType;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)&tex1,(string *)parameters,(SpectrumHandle *)&map,
               (SpectrumType)&local_38,alloc_00);
    std::__cxx11::string::~string((string *)&map);
    std::__cxx11::string::string<std::allocator<char>>((string *)&map,"tex2",&local_f1);
    local_40 = CONCAT44(extraout_var,iVar17) | 0x1000000000000;
    alloc_01.memoryResource._4_4_ = 0;
    alloc_01.memoryResource._0_4_ = spectrumType;
    TextureParameterDictionary::GetSpectrumTexture
              ((TextureParameterDictionary *)&tex2,(string *)parameters,(SpectrumHandle *)&map,
               (SpectrumType)&local_40,alloc_01);
    std::__cxx11::string::~string((string *)&map);
    if (iVar16 == 2) {
      TextureMapping2DHandle::Create(&map,parameters->dict,local_d8,local_d0,alloc);
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pSVar19 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_01,iVar16);
      (pSVar19->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = (uintptr_t)
              map.
              super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
              .bits;
      (pSVar19->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits = 0;
      pSVar19->tex[0].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar19->tex[1].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
    }
    else {
      map.
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = *(TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
                *)(local_d8->mInv).m[0];
      TVar1.bits = *(uintptr_t *)((local_d8->mInv).m[0] + 2);
      TVar2.bits = *(uintptr_t *)(local_d8->mInv).m[1];
      TVar3.bits = *(uintptr_t *)((local_d8->mInv).m[1] + 2);
      TVar4.bits = *(uintptr_t *)(local_d8->mInv).m[2];
      TVar5.bits = *(uintptr_t *)((local_d8->mInv).m[2] + 2);
      TVar6.bits = *(uintptr_t *)(local_d8->mInv).m[3];
      TVar7.bits = *(uintptr_t *)((local_d8->mInv).m[3] + 2);
      TVar8.bits = *(uintptr_t *)(local_d8->m).m[0];
      TVar9.bits = *(uintptr_t *)((local_d8->m).m[0] + 2);
      TVar10.bits = *(uintptr_t *)(local_d8->m).m[1];
      TVar11.bits = *(uintptr_t *)((local_d8->m).m[1] + 2);
      TVar12.bits = *(uintptr_t *)(local_d8->m).m[2];
      TVar13.bits = *(uintptr_t *)((local_d8->m).m[2] + 2);
      TVar14.bits = *(uintptr_t *)(local_d8->m).m[3];
      TVar15.bits = *(uintptr_t *)((local_d8->m).m[3] + 2);
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
      pTVar20 = (TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
                 *)CONCAT44(extraout_var_02,iVar16);
      pTVar20->bits =
           (uintptr_t)
           map.
           super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
           .bits;
      pTVar20[1].bits = TVar1.bits;
      pTVar20[2].bits = TVar2.bits;
      pTVar20[3].bits = TVar3.bits;
      pTVar20[4].bits = TVar4.bits;
      pTVar20[5].bits = TVar5.bits;
      pTVar20[6].bits = TVar6.bits;
      pTVar20[7].bits = TVar7.bits;
      pTVar20[8].bits = TVar8.bits;
      pTVar20[9].bits = TVar9.bits;
      pTVar20[10].bits = TVar10.bits;
      pTVar20[0xb].bits = TVar11.bits;
      pTVar20[0xc].bits = TVar12.bits;
      pTVar20[0xd].bits = TVar13.bits;
      pTVar20[0xe].bits = TVar14.bits;
      pTVar20[0xf].bits = TVar15.bits;
      iVar16 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
      pSVar19 = (SpectrumCheckerboardTexture *)CONCAT44(extraout_var_03,iVar16);
      (pSVar19->map2D).
      super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
      .bits = 0;
      (pSVar19->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits =
           (ulong)pTVar20 | 0x1000000000000;
      pSVar19->tex[0].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex1.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
      pSVar19->tex[1].
      super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
      .bits = (uintptr_t)
              tex2.
              super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
    }
  }
  return pSVar19;
}

Assistant:

SpectrumCheckerboardTexture *SpectrumCheckerboardTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    int dim = parameters.GetOneInt("dimension", 2);
    if (dim != 2 && dim != 3) {
        Error(loc, "%d dimensional checkerboard texture not supported", dim);
        return nullptr;
    }

    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);

    SpectrumTextureHandle tex1 =
        parameters.GetSpectrumTexture("tex1", one, spectrumType, alloc);
    SpectrumTextureHandle tex2 =
        parameters.GetSpectrumTexture("tex2", zero, spectrumType, alloc);
    if (dim == 2) {
        // Initialize 2D texture mapping _map_ from _tp_
        TextureMapping2DHandle map =
            TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

        return alloc.new_object<SpectrumCheckerboardTexture>(map, nullptr, tex1, tex2);
    } else {
        // Initialize 3D texture mapping _map_ from _tp_
        TextureMapping3DHandle map =
            TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
        return alloc.new_object<SpectrumCheckerboardTexture>(nullptr, map, tex1, tex2);
    }
}